

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeInteger.c
# Opt level: O3

asn_enc_rval_t *
NativeInteger_encode_der
          (asn_enc_rval_t *__return_storage_ptr__,asn_TYPE_descriptor_t *sd,void *ptr,int tag_mode,
          ber_tlv_tag_t tag,asn_app_consume_bytes_f *cb,void *app_key)

{
  ulong uVar1;
  undefined1 *puVar2;
  uint8_t buf [8];
  INTEGER_t tmp;
  undefined1 local_28 [8];
  undefined1 *local_20;
  undefined4 local_18;
  
  uVar1 = *ptr;
  puVar2 = local_28 + 7;
  local_20 = local_28;
  do {
    *puVar2 = (char)uVar1;
    puVar2 = puVar2 + -1;
    uVar1 = uVar1 >> 8;
  } while (local_20 <= puVar2);
  local_18 = 8;
  INTEGER_encode_der(__return_storage_ptr__,sd,&local_20,tag_mode,tag,cb,app_key);
  if (__return_storage_ptr__->encoded == -1) {
    __return_storage_ptr__->structure_ptr = ptr;
  }
  return __return_storage_ptr__;
}

Assistant:

asn_enc_rval_t
NativeInteger_encode_der(asn_TYPE_descriptor_t *sd, void *ptr,
	int tag_mode, ber_tlv_tag_t tag,
	asn_app_consume_bytes_f *cb, void *app_key) {
	unsigned long native = *(unsigned long *)ptr;	/* Disable sign ext. */
	asn_enc_rval_t erval;
	INTEGER_t tmp;

#ifdef	WORDS_BIGENDIAN		/* Opportunistic optimization */

	tmp.buf = (uint8_t *)&native;
	tmp.size = sizeof(native);

#else	/* Works even if WORDS_BIGENDIAN is not set where should've been */
	uint8_t buf[sizeof(native)];
	uint8_t *p;

	/* Prepare a fake INTEGER */
	for(p = buf + sizeof(buf) - 1; p >= buf; p--, native >>= 8)
		*p = (uint8_t)native;

	tmp.buf = buf;
	tmp.size = sizeof(buf);
#endif	/* WORDS_BIGENDIAN */
	
	/* Encode fake INTEGER */
	erval = INTEGER_encode_der(sd, &tmp, tag_mode, tag, cb, app_key);
	if(erval.encoded == -1) {
		assert(erval.structure_ptr == &tmp);
		erval.structure_ptr = ptr;
	}
	return erval;
}